

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt__sort_edges_quicksort(stbtt__edge *p,int n)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  stbtt__edge *psVar9;
  stbtt__edge *psVar10;
  int local_48;
  float local_40;
  int z;
  int j;
  int i;
  int m;
  int c;
  int c12;
  int c01;
  stbtt__edge t;
  int n_local;
  stbtt__edge *p_local;
  
  t.y1 = (float)n;
  unique0x10000442 = p;
  while (0xc < (int)t.y1) {
    iVar8 = (int)t.y1 >> 1;
    bVar2 = stack0xfffffffffffffff0[iVar8].y0 < stack0xfffffffffffffff0[(int)t.y1 + -1].y0;
    if (stack0xfffffffffffffff0->y0 < stack0xfffffffffffffff0[iVar8].y0 != bVar2) {
      if (stack0xfffffffffffffff0->y0 < stack0xfffffffffffffff0[(int)t.y1 + -1].y0 == bVar2) {
        local_48 = 0;
      }
      else {
        local_48 = (int)t.y1 + -1;
      }
      psVar9 = stack0xfffffffffffffff0 + local_48;
      fVar4 = psVar9->x0;
      fVar5 = psVar9->y0;
      fVar6 = psVar9->x1;
      fVar7 = psVar9->y1;
      iVar1 = psVar9->invert;
      psVar9 = stack0xfffffffffffffff0 + local_48;
      psVar10 = stack0xfffffffffffffff0 + iVar8;
      fVar3 = psVar10->y0;
      psVar9->x0 = psVar10->x0;
      psVar9->y0 = fVar3;
      fVar3 = psVar10->y1;
      psVar9->x1 = psVar10->x1;
      psVar9->y1 = fVar3;
      psVar9->invert = psVar10->invert;
      psVar9 = stack0xfffffffffffffff0 + iVar8;
      psVar9->x0 = fVar4;
      psVar9->y0 = fVar5;
      psVar9->x1 = fVar6;
      psVar9->y1 = fVar7;
      psVar9->invert = iVar1;
    }
    fVar4 = stack0xfffffffffffffff0->x0;
    fVar5 = stack0xfffffffffffffff0->y0;
    fVar6 = stack0xfffffffffffffff0->x1;
    fVar7 = stack0xfffffffffffffff0->y1;
    iVar1 = stack0xfffffffffffffff0->invert;
    psVar9 = stack0xfffffffffffffff0 + iVar8;
    fVar3 = psVar9->y0;
    unique0x1000030e->x0 = psVar9->x0;
    unique0x1000030e->y0 = fVar3;
    fVar3 = psVar9->y1;
    unique0x1000030e->x1 = psVar9->x1;
    unique0x1000030e->y1 = fVar3;
    stack0xfffffffffffffff0->invert = psVar9->invert;
    psVar9 = stack0xfffffffffffffff0 + iVar8;
    psVar9->x0 = fVar4;
    psVar9->y0 = fVar5;
    psVar9->x1 = fVar6;
    psVar9->y1 = fVar7;
    psVar9->invert = iVar1;
    z = 1;
    local_40 = t.y1;
    while( true ) {
      while (stack0xfffffffffffffff0[z].y0 < stack0xfffffffffffffff0->y0) {
        z = z + 1;
      }
      do {
        local_40 = (float)((int)local_40 + -1);
      } while (stack0xfffffffffffffff0->y0 < stack0xfffffffffffffff0[(int)local_40].y0);
      if ((int)local_40 <= z) break;
      psVar9 = stack0xfffffffffffffff0 + z;
      fVar4 = psVar9->x0;
      fVar5 = psVar9->y0;
      fVar6 = psVar9->x1;
      fVar7 = psVar9->y1;
      iVar8 = psVar9->invert;
      psVar9 = stack0xfffffffffffffff0 + z;
      psVar10 = stack0xfffffffffffffff0 + (int)local_40;
      fVar3 = psVar10->y0;
      psVar9->x0 = psVar10->x0;
      psVar9->y0 = fVar3;
      fVar3 = psVar10->y1;
      psVar9->x1 = psVar10->x1;
      psVar9->y1 = fVar3;
      psVar9->invert = psVar10->invert;
      psVar9 = stack0xfffffffffffffff0 + (int)local_40;
      psVar9->x0 = fVar4;
      psVar9->y0 = fVar5;
      psVar9->x1 = fVar6;
      psVar9->y1 = fVar7;
      psVar9->invert = iVar8;
      z = z + 1;
    }
    if ((int)local_40 < (int)t.y1 - z) {
      stbtt__sort_edges_quicksort(stack0xfffffffffffffff0,(int)local_40);
      register0x00000000 = stack0xfffffffffffffff0 + z;
      t.y1 = (float)((int)t.y1 - z);
    }
    else {
      stbtt__sort_edges_quicksort(stack0xfffffffffffffff0 + z,(int)t.y1 - z);
      t.y1 = local_40;
    }
  }
  return;
}

Assistant:

static void stbtt__sort_edges_quicksort(stbtt__edge *p, int n)
{
   /* threshold for transitioning to insertion sort */
   while (n > 12) {
      stbtt__edge t;
      int c01,c12,c,m,i,j;

      /* compute median of three */
      m = n >> 1;
      c01 = STBTT__COMPARE(&p[0],&p[m]);
      c12 = STBTT__COMPARE(&p[m],&p[n-1]);
      /* if 0 >= mid >= end, or 0 < mid < end, then use mid */
      if (c01 != c12) {
         /* otherwise, we'll need to swap something else to middle */
         int z;
         c = STBTT__COMPARE(&p[0],&p[n-1]);
         /* 0>mid && mid<n:  0>n => n; 0<n => 0 */
         /* 0<mid && mid>n:  0>n => 0; 0<n => n */
         z = (c == c12) ? 0 : n-1;
         t = p[z];
         p[z] = p[m];
         p[m] = t;
      }
      /* now p[m] is the median-of-three */
      /* swap it to the beginning so it won't move around */
      t = p[0];
      p[0] = p[m];
      p[m] = t;

      /* partition loop */
      i=1;
      j=n-1;
      for(;;) {
         /* handling of equality is crucial here */
         /* for sentinels & efficiency with duplicates */
         for (;;++i) {
            if (!STBTT__COMPARE(&p[i], &p[0])) break;
         }
         for (;;--j) {
            if (!STBTT__COMPARE(&p[0], &p[j])) break;
         }
         /* make sure we haven't crossed */
         if (i >= j) break;
         t = p[i];
         p[i] = p[j];
         p[j] = t;

         ++i;
         --j;
      }
      /* recurse on smaller side, iterate on larger */
      if (j < (n-i)) {
         stbtt__sort_edges_quicksort(p,j);
         p = p+i;
         n = n-i;
      } else {
         stbtt__sort_edges_quicksort(p+i, n-i);
         n = j;
      }
   }
}